

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

ScriptPtr * FBehavior::StaticFindScript(int script,FBehavior **module)

{
  FBehavior *this;
  ScriptPtr *pSVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)StaticModules.Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      this = StaticModules.Array[uVar3];
      pSVar1 = FindScript(this,script);
      if (pSVar1 != (ScriptPtr *)0x0) {
        *module = this;
        return pSVar1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return (ScriptPtr *)0x0;
}

Assistant:

const ScriptPtr *FBehavior::StaticFindScript (int script, FBehavior *&module)
{
	for (DWORD i = 0; i < StaticModules.Size(); ++i)
	{
		const ScriptPtr *code = StaticModules[i]->FindScript (script);
		if (code != NULL)
		{
			module = StaticModules[i];
			return code;
		}
	}
	return NULL;
}